

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::erase
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  StringPtr *pSVar1;
  long lVar2;
  long lVar3;
  size_t pos;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  ArrayPtr<unsigned_int>_conflict table;
  undefined4 local_5c;
  StringPtr local_58;
  long *local_48;
  undefined4 *local_40;
  long local_38;
  long local_30;
  
  pSVar1 = *(StringPtr **)this;
  pos = (long)row - (long)pSVar1 >> 2;
  table.size_ = *(long *)(this + 8) - (long)pSVar1 >> 2;
  local_58.content.ptr =
       (char *)CONCAT44(local_58.content.ptr._4_4_,*(undefined4 *)&(row->content).ptr);
  table.ptr = pSVar1;
  TreeIndex<kj::_::(anonymous_namespace)::UintCompare>::erase<unsigned_int,unsigned_int>
            ((TreeIndex<kj::_::(anonymous_namespace)::UintCompare> *)(this + 0x20),table,pos,
             &local_58);
  local_38 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  lVar3 = lVar2 - local_38 >> 2;
  if (lVar3 - 1U != pos) {
    local_5c = *(undefined4 *)(local_38 + -4 + lVar3 * 4);
    local_40 = &local_5c;
    local_48 = &local_38;
    local_58.content.ptr = (char *)&PTR_search_0021bb90;
    local_58.content.size_ = (size_t)(this + 0x20);
    local_30 = lVar3;
    _::BTreeImpl::renumber
              ((BTreeImpl *)(this + 0x28),(uint)(lVar3 - 1U),(uint)pos,(SearchKey *)&local_58);
    *(undefined4 *)(*(long *)this + ((long)row - (long)pSVar1)) =
         *(undefined4 *)(*(long *)this + -4 + lVar3 * 4);
    lVar2 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar2 + -4;
  return;
}

Assistant:

void Table<Row, Indexes...>::erase(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  eraseImpl(&row - rows.begin());
}